

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::ShowFontAtlas(ImFontAtlas *atlas)

{
  undefined4 uVar1;
  undefined4 uVar2;
  ImFont *font;
  bool bVar3;
  ImFont **ppIVar4;
  int i;
  int i_00;
  ImVec2 local_60;
  ImVec2 local_58;
  ImVec2 local_50;
  ImVec4 local_48;
  ImVec4 local_38;
  
  for (i_00 = 0; i_00 < (atlas->Fonts).Size; i_00 = i_00 + 1) {
    ppIVar4 = ImVector<ImFont_*>::operator[](&atlas->Fonts,i_00);
    font = *ppIVar4;
    PushID(font);
    DebugNodeFont(font);
    PopID();
  }
  bVar3 = TreeNode("Atlas texture","Atlas texture (%dx%d pixels)",(ulong)(uint)atlas->TexWidth,
                   (ulong)(uint)atlas->TexHeight);
  if (bVar3) {
    local_38.x = 1.0;
    local_38.y = 1.0;
    local_38.z = 1.0;
    local_38.w = 1.0;
    local_48.x = 1.0;
    local_48.y = 1.0;
    local_48.z = 1.0;
    local_48.w = 0.5;
    uVar1 = atlas->TexWidth;
    uVar2 = atlas->TexHeight;
    local_58.x = 0.0;
    local_58.y = 0.0;
    local_50.y = (float)(int)uVar2;
    local_50.x = (float)(int)uVar1;
    local_60.x = 1.0;
    local_60.y = 1.0;
    Image(atlas->TexID,&local_50,&local_58,&local_60,&local_38,&local_48);
    TreePop();
  }
  return;
}

Assistant:

void ImGui::ShowFontAtlas(ImFontAtlas* atlas)
{
    for (int i = 0; i < atlas->Fonts.Size; i++)
    {
        ImFont* font = atlas->Fonts[i];
        PushID(font);
        DebugNodeFont(font);
        PopID();
    }
    if (TreeNode("Atlas texture", "Atlas texture (%dx%d pixels)", atlas->TexWidth, atlas->TexHeight))
    {
        ImVec4 tint_col = ImVec4(1.0f, 1.0f, 1.0f, 1.0f);
        ImVec4 border_col = ImVec4(1.0f, 1.0f, 1.0f, 0.5f);
        Image(atlas->TexID, ImVec2((float)atlas->TexWidth, (float)atlas->TexHeight), ImVec2(0.0f, 0.0f), ImVec2(1.0f, 1.0f), tint_col, border_col);
        TreePop();
    }
}